

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O3

uint * RDL_getEdgesURF(RDL_data *data,uint index)

{
  uint bcc_index;
  uint uVar1;
  RDL_graph *pRVar2;
  char *edges;
  void *__ptr;
  uint *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint rcf_internal_index;
  
  bcc_index = data->urf_to_bcc[index][0];
  uVar6 = data->urf_to_bcc[index][1];
  pRVar2 = data->bccGraphs->bcc_graphs[bcc_index];
  uVar4 = (ulong)pRVar2->E;
  edges = (char *)calloc(1,uVar4);
  uVar1 = data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[uVar6];
  __ptr = malloc(0x100);
  if (uVar1 != 0) {
    rcf_internal_index = 0;
    do {
      RDL_getEdges_internal(data,bcc_index,uVar6,rcf_internal_index,edges);
      rcf_internal_index = rcf_internal_index + 1;
    } while (uVar1 != rcf_internal_index);
    uVar4 = (ulong)pRVar2->E;
  }
  if ((int)uVar4 == 0) {
    uVar6 = 0;
  }
  else {
    uVar5 = 0x40;
    uVar7 = 0;
    uVar6 = 0;
    do {
      if (edges[uVar7] == '\x01') {
        if (uVar6 == (uint)uVar5) {
          uVar5 = (ulong)(uVar6 * 2);
          __ptr = realloc(__ptr,uVar5 * 4);
        }
        uVar4 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
        *(uint *)((long)__ptr + uVar4 * 4) =
             data->bccGraphs->edge_from_bcc_mapping[bcc_index][uVar7];
        uVar4 = (ulong)pRVar2->E;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar4);
  }
  puVar3 = (uint *)realloc(__ptr,(ulong)(uVar6 + 1) << 2);
  puVar3[uVar6] = 0xffffffff;
  free(edges);
  return puVar3;
}

Assistant:

static unsigned *RDL_getEdgesURF(const RDL_data *data, unsigned index)
{
  unsigned i,nofFams,nextfree=0,alloced, bcc_index, internal_index;
  char *edges;
  unsigned *result;
  const RDL_graph* graph;

  /* map indices */
  bcc_index = data->urf_to_bcc[index][0];
  internal_index = data->urf_to_bcc[index][1];
  graph = data->bccGraphs->bcc_graphs[bcc_index];
  edges = malloc(graph->E * sizeof(*edges));
  memset(edges, 0, graph->E * sizeof(*edges));

  nofFams = data->urfInfoPerBCC[bcc_index]->nofCFsPerURF[internal_index];
  alloced = RDL_RESERVED_START;
  result = malloc(alloced * sizeof(*result));

  /* iterate over all RCFs in this URF and collect results in bitset (edges) */
  for(i=0; i<nofFams; ++i) {
    RDL_getEdges_internal(data, bcc_index, internal_index, i, edges);
  }

  /* translate into dynamic table */
  for(i=0; i<graph->E; ++i) {
    if(edges[i] == 1) {
      if(nextfree == alloced)
      {/*double the size*/
        alloced *= 2;
        result = realloc(result, alloced*sizeof(*result));
      }
      result[nextfree++] = data->bccGraphs->edge_from_bcc_mapping[bcc_index][i];
    }
  }
  result = realloc(result, (nextfree+1)*sizeof(*result));

  result[nextfree] = UINT_MAX;

  free(edges);
  return result;
}